

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall MarrayTest::assignmentOperatorTest<false>(MarrayTest *this)

{
  int iVar1;
  undefined8 uVar2;
  pointer piVar3;
  MarrayTest *pMVar4;
  value_type *__val_1;
  reference piVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  size_t sVar7;
  size_t sVar8;
  reference piVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  logic_error *plVar11;
  code *pcVar12;
  size_t sVar13;
  int iVar14;
  value_type *__val_3;
  undefined *puVar15;
  value_type *__val;
  long lVar16;
  value_type *__val_6;
  Marray<int,_std::allocator<unsigned_long>_> n;
  Marray<int,_std::allocator<unsigned_long>_> m;
  int scalar;
  int local_ec;
  undefined1 local_e8 [16];
  size_t *local_d8;
  size_t *psStack_d0;
  size_t *local_c8;
  size_t sStack_c0;
  size_t local_b8;
  CoordinateOrder local_b0;
  bool local_ac;
  Marray<int,_std::allocator<unsigned_long>_> local_a0;
  unsigned_long *local_58;
  int local_4c;
  int *local_48;
  MarrayTest *local_40;
  unsigned_long *local_38;
  
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&local_a0,(allocator_type *)local_e8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,(allocator_type *)&local_ec);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,&local_a0);
  operator_delete((void *)local_e8._0_8_,local_b8 << 2);
  operator_delete(local_d8,sStack_c0 * 0x18);
  operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                  local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ <<
                  2);
  operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_,
                  local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ * 0x18);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_a0,&this->scalar_,&andres::defaultOrder,(allocator_type *)local_e8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,(allocator_type *)&local_ec);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,&local_a0);
  if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
  }
  else {
    if ((pointer)local_e8._0_8_ != (pointer)0x0) {
      if ((local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ ==
           sStack_c0) &&
         (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
          local_b8)) {
        local_ec = 0;
        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           (&local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>,
                            &local_ec);
        iVar14 = *piVar5;
        local_ec = 0;
        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,&local_ec);
        if (iVar14 == *piVar5) {
          operator_delete((void *)local_e8._0_8_,local_b8 << 2);
          operator_delete(local_d8,sStack_c0 * 0x18);
          operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                          local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          _Var6._M_current = (unsigned_long *)operator_new(8);
          *_Var6._M_current = 0x18;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,_Var6,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var6._M_current + 1),&this->scalar_,&andres::defaultOrder,
                     (allocator_type *)local_e8);
          andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                    ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,
                     (allocator_type *)&local_ec);
          andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                    ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,&local_a0);
          local_40 = this;
          if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
              local_b8) {
LAB_001dae72:
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar11,"test failed.");
            pcVar12 = std::logic_error::~logic_error;
            puVar15 = &std::logic_error::typeinfo;
            goto LAB_001db16d;
          }
          if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0)
          {
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          }
          else {
            if ((pointer)local_e8._0_8_ != (pointer)0x0) {
              if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ != sStack_c0) goto LAB_001dae72;
              iVar14 = 0;
              do {
                local_ec = iVar14;
                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   (&local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>
                                    ,&local_ec);
                iVar1 = *piVar5;
                local_ec = iVar14;
                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,
                                    &local_ec);
                if (iVar1 != *piVar5) {
                  plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar11,"test failed.");
                  __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 != 0x18);
              operator_delete((void *)local_e8._0_8_,local_b8 << 2);
              operator_delete(local_d8,sStack_c0 * 0x18);
              operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                              local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var6._M_current,8);
              _Var6._M_current = (unsigned_long *)operator_new(0x10);
              *_Var6._M_current = 0;
              _Var6._M_current[1] = 0;
              *_Var6._M_current = 6;
              _Var6._M_current[1] = 4;
              andres::Marray<int,std::allocator<unsigned_long>>::
              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,_Var6,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var6._M_current + 2),&local_40->scalar_,&andres::defaultOrder,
                         (allocator_type *)local_e8);
              andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                        ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,
                         (allocator_type *)&local_ec);
              andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                        ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,&local_a0);
              if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
                  local_b8) {
LAB_001daea1:
                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar11,"test failed.");
                pcVar12 = std::logic_error::~logic_error;
                puVar15 = &std::logic_error::typeinfo;
                goto LAB_001db1bd;
              }
              if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                  (pointer)0x0) {
                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
              }
              else {
                if ((pointer)local_e8._0_8_ != (pointer)0x0) {
                  if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ != sStack_c0) goto LAB_001daea1;
                  sVar13 = 0;
                  do {
                    iVar14 = 0;
                    do {
                      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)&local_a0
                                          ,sVar13,iVar14);
                      iVar1 = *piVar5;
                      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)local_e8,
                                          sVar13,iVar14);
                      if (iVar1 != *piVar5) {
                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar11,"test failed.");
                        __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 != 4);
                    sVar13 = sVar13 + 1;
                  } while (sVar13 != 6);
                  operator_delete((void *)local_e8._0_8_,local_b8 << 2);
                  operator_delete(local_d8,sStack_c0 * 0x18);
                  operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  data_,local_a0.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.
                                        geometry_.size_ << 2);
                  operator_delete(local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_,
                                  local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ * 0x18);
                  operator_delete(_Var6._M_current,0x10);
                  local_48 = (int *)operator_new(0x18);
                  *(unsigned_long *)local_48 = 0;
                  *(unsigned_long *)((long)local_48 + 8) = 0;
                  *(unsigned_long *)local_48 = 3;
                  *(unsigned_long *)((long)local_48 + 8) = 4;
                  *(unsigned_long *)((long)local_48 + 0x10) = 2;
                  andres::Marray<int,std::allocator<unsigned_long>>::
                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_48,(unsigned_long *)((long)local_48 + 0x18),&local_40->scalar_,
                             &andres::defaultOrder,(allocator_type *)local_e8);
                  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,
                             (allocator_type *)&local_ec);
                  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e8,&local_a0);
                  if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ != local_b8) {
LAB_001daed0:
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar11,"test failed.");
                    pcVar12 = std::logic_error::~logic_error;
                    puVar15 = &std::logic_error::typeinfo;
                    goto LAB_001db20d;
                  }
                  if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                      (pointer)0x0) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
                  }
                  else {
                    if ((pointer)local_e8._0_8_ != (pointer)0x0) {
                      if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          dimension_ != sStack_c0) goto LAB_001daed0;
                      lVar16 = 0;
                      do {
                        sVar13 = 0;
                        do {
                          iVar14 = 0;
                          do {
                            andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                      (&local_a0.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>);
                            piVar3 = local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>
                                     .data_;
                            if ((local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_ == (pointer)0x0) ||
                               (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                geometry_.dimension_ != 3)) {
                              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar11,"Assertion failed.");
LAB_001daaea:
                              pcVar12 = std::runtime_error::~runtime_error;
                              puVar15 = &std::runtime_error::typeinfo;
LAB_001daaf8:
                              __cxa_throw(plVar11,puVar15,pcVar12);
                            }
                            sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    strides(&local_a0.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            0);
                            sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    elementAccessHelper<int>
                                              (&local_a0.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                               ,3,sVar13,iVar14);
                            iVar1 = piVar3[sVar7 * lVar16 + sVar8];
                            andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8)
                            ;
                            uVar2 = local_e8._0_8_;
                            if (((pointer)local_e8._0_8_ == (pointer)0x0) || (sStack_c0 != 3)) {
                              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar11,"Assertion failed.");
                              goto LAB_001daaea;
                            }
                            sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    strides((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_e8,0);
                            sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    elementAccessHelper<int>
                                              ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_e8,3,sVar13,iVar14);
                            if (iVar1 != *(int *)(uVar2 + (sVar7 * lVar16 + sVar8) * 4)) {
                              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar11,"test failed.");
                              pcVar12 = std::logic_error::~logic_error;
                              puVar15 = &std::logic_error::typeinfo;
                              goto LAB_001daaf8;
                            }
                            iVar14 = iVar14 + 1;
                          } while (iVar14 == 1);
                          sVar13 = sVar13 + 1;
                        } while (sVar13 != 4);
                        lVar16 = lVar16 + 1;
                      } while (lVar16 != 3);
                      operator_delete((void *)local_e8._0_8_,local_b8 << 2);
                      operator_delete(local_d8,sStack_c0 * 0x18);
                      operator_delete(local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      operator_delete(local_48,0x18);
                      local_e8._0_8_ = (pointer)0x0;
                      local_d8 = (size_t *)0x0;
                      psStack_d0 = (size_t *)0x0;
                      local_c8 = (size_t *)0x0;
                      sStack_c0 = 0;
                      local_b8 = 0;
                      local_b0 = LastMajorOrder;
                      local_ac = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
                      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                                (&local_a0,(allocator_type *)&local_ec);
                      pMVar4 = local_40;
                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
                                 (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
                      operator_delete(local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      operator_delete(local_d8,sStack_c0 * 0x18);
                      local_e8._0_8_ = pMVar4;
                      local_d8 = (size_t *)operator_new(0);
                      sStack_c0 = 0;
                      local_b8 = 1;
                      local_b0 = LastMajorOrder;
                      local_ac = true;
                      psStack_d0 = local_d8;
                      local_c8 = local_d8;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
                      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                                (&local_a0,(allocator_type *)&local_ec);
                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
                                 (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
                      if (local_b8 !=
                          local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_) goto LAB_001dae43;
                      if ((MarrayTest *)local_e8._0_8_ == (MarrayTest *)0x0) {
                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar11,"Assertion failed.");
                      }
                      else {
                        if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ !=
                            (pointer)0x0) {
                          if (sStack_c0 ==
                              local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_) {
                            local_ec = 0;
                            piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8,&local_ec);
                            iVar14 = *piVar5;
                            local_ec = 0;
                            piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               (&local_a0.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                                ,&local_ec);
                            if (iVar14 == *piVar5) {
                              operator_delete(local_a0.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                              operator_delete(local_a0.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_a0.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_d8,sStack_c0 * 0x18);
                              _Var6._M_current = (unsigned_long *)operator_new(8);
                              *_Var6._M_current = 0x18;
                              local_e8._0_8_ = pMVar4->data_;
                              local_48 = (int *)local_e8._0_8_;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),
                                         _Var6,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var6._M_current + 1),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_a0);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_e8);
                              andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                                        (&local_a0,(allocator_type *)&local_ec);
                              andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_e8);
                              if (local_b8 !=
                                  local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.size_) {
LAB_001daf5d:
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar11,"test failed.");
                                pcVar12 = std::logic_error::~logic_error;
                                puVar15 = &std::logic_error::typeinfo;
                                goto LAB_001db2dc;
                              }
                              if ((int *)local_e8._0_8_ == (int *)0x0) {
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar11,"Assertion failed.");
                              }
                              else {
                                if (local_a0.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                    data_ != (pointer)0x0) {
                                  if (sStack_c0 !=
                                      local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_) goto LAB_001daf5d;
                                  iVar14 = 0;
                                  do {
                                    local_ec = iVar14;
                                    piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                    iVar1 = *piVar5;
                                    local_ec = iVar14;
                                    piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                    if (iVar1 != *piVar5) {
                                      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar11,"test failed.");
                                      __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                  std::logic_error::~logic_error);
                                    }
                                    iVar14 = iVar14 + 1;
                                  } while (iVar14 != 0x18);
                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                  operator_delete(_Var6._M_current,8);
                                  _Var6._M_current = (unsigned_long *)operator_new(0x10);
                                  *_Var6._M_current = 0;
                                  _Var6._M_current[1] = 0;
                                  *_Var6._M_current = 6;
                                  _Var6._M_current[1] = 4;
                                  local_e8._0_8_ = local_48;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_e8 + 8),_Var6,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var6._M_current + 2),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_a0);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                                            (&local_a0,(allocator_type *)&local_ec);
                                  andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                            ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
                                             (View<int,_false,_std::allocator<unsigned_long>_> *)
                                             local_e8);
                                  if (local_b8 !=
                                      local_a0.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_) {
LAB_001daf8c:
                                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar11,"test failed.");
                                    pcVar12 = std::logic_error::~logic_error;
                                    puVar15 = &std::logic_error::typeinfo;
                                    goto LAB_001db32c;
                                  }
                                  if ((int *)local_e8._0_8_ == (int *)0x0) {
                                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar11,"Assertion failed.");
                                  }
                                  else {
                                    if (local_a0.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                        != (pointer)0x0) {
                                      if (sStack_c0 !=
                                          local_a0.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_) goto LAB_001daf8c;
                                      sVar13 = 0;
                                      do {
                                        iVar14 = 0;
                                        do {
                                          piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_e8,sVar13,iVar14);
                                          iVar1 = *piVar5;
                                          piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_a0,sVar13,iVar14);
                                          if (iVar1 != *piVar5) {
                                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar11,"test failed.");
                                            __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          iVar14 = iVar14 + 1;
                                        } while (iVar14 != 4);
                                        sVar13 = sVar13 + 1;
                                      } while (sVar13 != 6);
                                      operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                      operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                      operator_delete(local_d8,sStack_c0 * 0x18);
                                      operator_delete(_Var6._M_current,0x10);
                                      local_58 = (unsigned_long *)operator_new(0x18);
                                      *local_58 = 0;
                                      local_58[1] = 0;
                                      *local_58 = 3;
                                      local_58[1] = 4;
                                      local_58[2] = 2;
                                      local_e8._0_8_ = local_48;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_e8 + 8),
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_58,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_58 + 3),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_a0);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                                                (&local_a0,(allocator_type *)&local_ec);
                                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                                ((Marray<int,std::allocator<unsigned_long>> *)
                                                 &local_a0,
                                                 (View<int,_false,_std::allocator<unsigned_long>_> *
                                                 )local_e8);
                                      if (local_b8 !=
                                          local_a0.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_) {
LAB_001dafbb:
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar11,"test failed.");
                                        pcVar12 = std::logic_error::~logic_error;
                                        puVar15 = &std::logic_error::typeinfo;
                                        goto LAB_001db37c;
                                      }
                                      if ((int *)local_e8._0_8_ == (int *)0x0) {
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar11,"Assertion failed.");
                                      }
                                      else {
                                        if (local_a0.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            data_ != (pointer)0x0) {
                                          if (sStack_c0 !=
                                              local_a0.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_) goto LAB_001dafbb;
                                          lVar16 = 0;
                                          do {
                                            sVar13 = 0;
                                            do {
                                              iVar14 = 0;
                                              do {
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                uVar2 = local_e8._0_8_;
                                                if (((int *)local_e8._0_8_ == (int *)0x0) ||
                                                   (sStack_c0 != 3)) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
LAB_001dab66:
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001dab74:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                }
                                                sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,0);
                                                sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,3,sVar13,iVar14);
                                                iVar1 = *(int *)(uVar2 + (sVar7 * lVar16 + sVar8) *
                                                                         4);
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant(&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                piVar3 = local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                if ((local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  goto LAB_001dab66;
                                                }
                                                sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar13,iVar14);
                                                if (iVar1 != piVar3[sVar7 * lVar16 + sVar8]) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  goto LAB_001dab74;
                                                }
                                                iVar14 = iVar14 + 1;
                                              } while (iVar14 == 1);
                                              sVar13 = sVar13 + 1;
                                            } while (sVar13 != 4);
                                            lVar16 = lVar16 + 1;
                                          } while (lVar16 != 3);
                                          operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(local_d8,sStack_c0 * 0x18);
                                          operator_delete(local_58,0x18);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray(&local_a0,(allocator_type *)local_e8);
                                          pMVar4 = local_40;
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray((Marray<int,_std::allocator<unsigned_long>_> *)
                                                 local_e8,&local_40->scalar_,&andres::defaultOrder,
                                                 (allocator_type *)&local_ec);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          operator=((Marray<int,_std::allocator<unsigned_long>_> *)
                                                    local_e8,&local_a0);
                                          operator_delete((void *)local_e8._0_8_,local_b8 << 2);
                                          operator_delete(local_d8,sStack_c0 * 0x18);
                                          operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          local_4c = 2;
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray(&local_a0,&local_4c,&andres::defaultOrder,
                                                 (allocator_type *)local_e8);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray((Marray<int,_std::allocator<unsigned_long>_> *)
                                                 local_e8,&pMVar4->scalar_,&andres::defaultOrder,
                                                 (allocator_type *)&local_ec);
                                          local_ec = 0;
                                          piVar5 = andres::marray_detail::AccessOperatorHelper<true>
                                                   ::
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          operator=((Marray<int,_std::allocator<unsigned_long>_> *)
                                                    local_e8,&local_a0);
                                          local_ec = 0;
                                          piVar9 = andres::marray_detail::AccessOperatorHelper<true>
                                                   ::
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                          if (piVar9 != piVar5) {
                                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar11,"test failed.");
                                            __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          if (local_a0.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_ == (pointer)0x0) {
                                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar11,"Assertion failed.")
                                            ;
                                          }
                                          else {
                                            if ((int *)local_e8._0_8_ != (int *)0x0) {
                                              if ((local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == sStack_c0) &&
                                                 (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == local_b8)) {
                                                local_ec = 0;
                                                piVar5 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                iVar14 = *piVar5;
                                                local_ec = 0;
                                                piVar5 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                if (iVar14 == *piVar5) {
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_e8._0_8_ = (pointer)0x0;
                                                  local_d8 = (size_t *)0x0;
                                                  psStack_d0 = (size_t *)0x0;
                                                  local_c8 = (size_t *)0x0;
                                                  sStack_c0 = 0;
                                                  local_b8 = 0;
                                                  local_b0 = LastMajorOrder;
                                                  local_ac = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_a0,&pMVar4->scalar_,
                                                         &andres::defaultOrder,
                                                         (allocator_type *)&local_ec);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  local_e8._0_8_ = pMVar4;
                                                  local_d8 = (size_t *)operator_new(0);
                                                  sStack_c0 = 0;
                                                  local_b8 = 1;
                                                  local_b0 = LastMajorOrder;
                                                  local_ac = true;
                                                  psStack_d0 = local_d8;
                                                  local_c8 = local_d8;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_a0,&pMVar4->scalar_,
                                                         &andres::defaultOrder,
                                                         (allocator_type *)&local_ec);
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_b8 !=
                                                      local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) goto LAB_001daf2e;
                                                  if ((MarrayTest *)local_e8._0_8_ ==
                                                      (MarrayTest *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_c0 ==
                                                        local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_ec = 0;
                                                    piVar5 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  iVar14 = *piVar5;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if (iVar14 == *piVar5) {
                                                    operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_a0,(allocator_type *)local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_e8,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_e8,&local_a0);
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_4c = 2;
                                                  local_58 = (unsigned_long *)operator_new(8);
                                                  *local_58 = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_58,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_58 + 1),&local_4c,&andres::defaultOrder,
                                                  (allocator_type *)local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_e8,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_e8,&local_a0);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_b8) {
LAB_001dafea:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001db502;
                                                  }
                                                  if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((MarrayTest *)local_e8._0_8_ !=
                                                        (MarrayTest *)0x0) {
                                                      if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_c0)
                                                  goto LAB_001dafea;
                                                  iVar14 = 0;
                                                  do {
                                                    local_ec = iVar14;
                                                    piVar5 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  iVar1 = *piVar5;
                                                  local_ec = iVar14;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 != 0x18);
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_58,8);
                                                  local_e8._0_8_ = (pointer)0x0;
                                                  local_d8 = (size_t *)0x0;
                                                  psStack_d0 = (size_t *)0x0;
                                                  local_c8 = (size_t *)0x0;
                                                  sStack_c0 = 0;
                                                  local_b8 = 0;
                                                  local_b0 = LastMajorOrder;
                                                  local_ac = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  pMVar4 = local_40;
                                                  *_Var6._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&local_40->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  local_58 = (unsigned_long *)operator_new(8);
                                                  *local_58 = 0x18;
                                                  local_e8._0_8_ = local_48;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_e8 + 8),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_58,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_58 + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_a0)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_b8 !=
                                                      local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001db019:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001db584;
                                                  }
                                                  if ((int *)local_e8._0_8_ == (int *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_c0 !=
                                                        local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001db019;
                                                  iVar14 = 0;
                                                  do {
                                                    local_ec = iVar14;
                                                    piVar5 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  iVar1 = *piVar5;
                                                  local_ec = iVar14;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 != 0x18);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(local_58,8);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_a0,(allocator_type *)local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  pMVar4 = local_40;
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 4;
                                                  _Var6._M_current[1] = 6;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_e8,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),&local_40->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_e8,&local_a0);
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(_Var6._M_current,0x10);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_4c = 2;
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 6;
                                                  _Var6._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),&local_4c,
                                                  &andres::defaultOrder,(allocator_type *)local_e8);
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var10._M_current = 0;
                                                  _Var10._M_current[1] = 0;
                                                  *_Var10._M_current = 6;
                                                  _Var10._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_e8,_Var10,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_e8,&local_a0);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_b8) {
LAB_001db048:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001db606;
                                                  }
                                                  if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_e8._0_8_ != (int *)0x0) {
                                                      if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_c0)
                                                  goto LAB_001db048;
                                                  sVar13 = 0;
                                                  local_58 = _Var6._M_current;
                                                  do {
                                                    iVar14 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_a0,sVar13,iVar14);
                                                  iVar1 = *piVar5;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_e8,sVar13,iVar14);
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 != 4);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 6);
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(_Var10._M_current,0x10);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_58,0x10);
                                                  local_e8._0_8_ = (pointer)0x0;
                                                  local_d8 = (size_t *)0x0;
                                                  psStack_d0 = (size_t *)0x0;
                                                  local_c8 = (size_t *)0x0;
                                                  sStack_c0 = 0;
                                                  local_b8 = 0;
                                                  local_b0 = LastMajorOrder;
                                                  local_ac = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  pMVar4 = local_40;
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 4;
                                                  _Var6._M_current[1] = 6;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),&local_40->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var6._M_current,0x10);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 6;
                                                  _Var6._M_current[1] = 4;
                                                  local_e8._0_8_ = local_48;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_e8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_a0)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var10._M_current = 0;
                                                  _Var10._M_current[1] = 0;
                                                  *_Var10._M_current = 6;
                                                  _Var10._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,_Var10,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_b8 !=
                                                      local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001db077:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001db688;
                                                  }
                                                  if ((int *)local_e8._0_8_ == (int *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_c0 !=
                                                        local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001db077;
                                                  sVar13 = 0;
                                                  local_58 = _Var6._M_current;
                                                  do {
                                                    iVar14 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_e8,sVar13,iVar14);
                                                  iVar1 = *piVar5;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_a0,sVar13,iVar14);
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 != 4);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 6);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var10._M_current,0x10);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(local_58,0x10);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_a0,(allocator_type *)local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  pMVar4 = local_40;
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 2;
                                                  _Var6._M_current[1] = 3;
                                                  _Var6._M_current[2] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_e8,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),&local_40->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_e8,&local_a0);
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(_Var6._M_current,0x18);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_4c = 2;
                                                  local_58 = (unsigned_long *)operator_new(0x18);
                                                  *local_58 = 0;
                                                  local_58[1] = 0;
                                                  *local_58 = 3;
                                                  local_58[1] = 4;
                                                  local_58[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_58,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_58 + 3),&local_4c,&andres::defaultOrder,
                                                  (allocator_type *)local_e8);
                                                  local_38 = (unsigned_long *)operator_new(0x18);
                                                  *local_38 = 0;
                                                  local_38[1] = 0;
                                                  *local_38 = 3;
                                                  local_38[1] = 4;
                                                  local_38[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_e8,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_38,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_38 + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_e8,&local_a0);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_b8) {
LAB_001db0a6:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001db70a;
                                                  }
                                                  if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_e8._0_8_ != (int *)0x0) {
                                                      if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_c0)
                                                  goto LAB_001db0a6;
                                                  lVar16 = 0;
                                                  do {
                                                    sVar13 = 0;
                                                    do {
                                                      iVar14 = 0;
                                                      do {
                                                        andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar3 = local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
LAB_001dabe2:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
LAB_001dabf0:
                                                    __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar13,iVar14);
                                                  iVar1 = piVar3[sVar7 * lVar16 + sVar8];
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  uVar2 = local_e8._0_8_;
                                                  if (((int *)local_e8._0_8_ == (int *)0x0) ||
                                                     (sStack_c0 != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    goto LAB_001dabe2;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,3,sVar13,iVar14);
                                                  if (iVar1 != *(int *)(uVar2 + (sVar7 * lVar16 +
                                                                                sVar8) * 4)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001dabf0;
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 == 1);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 4);
                                                  lVar16 = lVar16 + 1;
                                                  } while (lVar16 != 3);
                                                  operator_delete((void *)local_e8._0_8_,
                                                                  local_b8 << 2);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(local_38,0x18);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_58,0x18);
                                                  local_e8._0_8_ = (pointer)0x0;
                                                  local_d8 = (size_t *)0x0;
                                                  psStack_d0 = (size_t *)0x0;
                                                  local_c8 = (size_t *)0x0;
                                                  sStack_c0 = 0;
                                                  local_b8 = 0;
                                                  local_b0 = LastMajorOrder;
                                                  local_ac = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  pMVar4 = local_40;
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 2;
                                                  _Var6._M_current[1] = 3;
                                                  _Var6._M_current[2] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),&local_40->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var6._M_current,0x18);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 4;
                                                  _Var6._M_current[2] = 2;
                                                  local_e8._0_8_ = local_48;
                                                  local_48 = (int *)_Var6._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_e8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_a0)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  local_58 = (unsigned_long *)operator_new(0x18);
                                                  *local_58 = 0;
                                                  local_58[1] = 0;
                                                  *local_58 = 3;
                                                  local_58[1] = 4;
                                                  local_58[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_58,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_58 + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_ec)
                                                  ;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_a0,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_e8);
                                                  local_ec = 0;
                                                  piVar9 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if (piVar9 != piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_b8 ==
                                                      local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
                                                    if ((int *)local_e8._0_8_ == (int *)0x0) {
                                                      plVar11 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar11,
                                                                 "Assertion failed.");
                                                    }
                                                    else {
                                                      if (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_c0 ==
                                                        local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    lVar16 = 0;
                                                    do {
                                                      sVar13 = 0;
                                                      do {
                                                        iVar14 = 0;
                                                        do {
                                                          andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8);
                                                  uVar2 = local_e8._0_8_;
                                                  if (((int *)local_e8._0_8_ == (int *)0x0) ||
                                                     (sStack_c0 != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
LAB_001dac5e:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
LAB_001dac6c:
                                                    __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_e8,3,sVar13,iVar14);
                                                  iVar1 = *(int *)(uVar2 + (sVar7 * lVar16 + sVar8)
                                                                           * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar3 = local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    goto LAB_001dac5e;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar13,iVar14);
                                                  if (iVar1 != piVar3[sVar7 * lVar16 + sVar8]) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001dac6c;
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 == 1);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 4);
                                                  lVar16 = lVar16 + 1;
                                                  if (lVar16 == 3) {
                                                    operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_a0.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_58,0x18);
                                                  operator_delete(local_d8,sStack_c0 * 0x18);
                                                  operator_delete(local_48,0x18);
                                                  return;
                                                  }
                                                  } while( true );
                                                  }
                                                  goto LAB_001db215;
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
LAB_001db215:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db70a:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db688:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db606:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db584:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db502:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  }
LAB_001daf2e:
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  goto LAB_001db480;
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db480:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                }
                                              }
                                              plVar11 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::logic_error::logic_error(plVar11,"test failed.");
                                              pcVar12 = std::logic_error::~logic_error;
                                              puVar15 = &std::logic_error::typeinfo;
                                              goto LAB_001db3fe;
                                            }
                                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar11,"Assertion failed.")
                                            ;
                                          }
                                          pcVar12 = std::runtime_error::~runtime_error;
                                          puVar15 = &std::runtime_error::typeinfo;
LAB_001db3fe:
                                          __cxa_throw(plVar11,puVar15,pcVar12);
                                        }
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar11,"Assertion failed.");
                                      }
                                      pcVar12 = std::runtime_error::~runtime_error;
                                      puVar15 = &std::runtime_error::typeinfo;
LAB_001db37c:
                                      __cxa_throw(plVar11,puVar15,pcVar12);
                                    }
                                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar11,"Assertion failed.");
                                  }
                                  pcVar12 = std::runtime_error::~runtime_error;
                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db32c:
                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                }
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar11,"Assertion failed.");
                              }
                              pcVar12 = std::runtime_error::~runtime_error;
                              puVar15 = &std::runtime_error::typeinfo;
LAB_001db2dc:
                              __cxa_throw(plVar11,puVar15,pcVar12);
                            }
                          }
LAB_001dae43:
                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar11,"test failed.");
                          pcVar12 = std::logic_error::~logic_error;
                          puVar15 = &std::logic_error::typeinfo;
                          goto LAB_001db28c;
                        }
                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar11,"Assertion failed.");
                      }
                      pcVar12 = std::runtime_error::~runtime_error;
                      puVar15 = &std::runtime_error::typeinfo;
LAB_001db28c:
                      __cxa_throw(plVar11,puVar15,pcVar12);
                    }
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
                  }
                  pcVar12 = std::runtime_error::~runtime_error;
                  puVar15 = &std::runtime_error::typeinfo;
LAB_001db20d:
                  __cxa_throw(plVar11,puVar15,pcVar12);
                }
                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
              }
              pcVar12 = std::runtime_error::~runtime_error;
              puVar15 = &std::runtime_error::typeinfo;
LAB_001db1bd:
              __cxa_throw(plVar11,puVar15,pcVar12);
            }
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          }
          pcVar12 = std::runtime_error::~runtime_error;
          puVar15 = &std::runtime_error::typeinfo;
LAB_001db16d:
          __cxa_throw(plVar11,puVar15,pcVar12);
        }
      }
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar11,"test failed.");
      pcVar12 = std::logic_error::~logic_error;
      puVar15 = &std::logic_error::typeinfo;
      goto LAB_001db11d;
    }
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
  }
  pcVar12 = std::runtime_error::~runtime_error;
  puVar15 = &std::runtime_error::typeinfo;
LAB_001db11d:
  __cxa_throw(plVar11,puVar15,pcVar12);
}

Assistant:

void MarrayTest::assignmentOperatorTest(){
    // empty
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n;
                n = m;
            }
            // scalar
            {
                andres::Marray<int> m(scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);

                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
            // 3D 
            {
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m;
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
    // scalar
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n(scalar_);
                n = m;
            }
            // scalar
            {
                int scalar = 2;
                andres::Marray<int> m(scalar);
                andres::Marray<int> n(scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m(scalar_);
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m(scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
        }
    }
    // 1D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 1D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address
                );
                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                m = v;
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
        }
    }
    // 2D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 2D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() && v.dimension()==m.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
        }
    }
    // 3D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 3D 
            {
                int scalar = 2;
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
}